

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O0

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetSerializedShader
          (DeviceObjectArchive *this,DeviceType Type,size_t Idx)

{
  int iVar1;
  const_reference this_00;
  size_type sVar2;
  value_type *DeviceShaders;
  size_t Idx_local;
  DeviceType Type_local;
  DeviceObjectArchive *this_local;
  
  this_00 = std::
            array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
            ::operator[](&this->m_DeviceShaders,(ulong)Type);
  sVar2 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::size
                    (this_00);
  if (Idx < sVar2) {
    this_local = (DeviceObjectArchive *)
                 std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                 operator[](this_00,Idx);
  }
  else {
    if (GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)::NullData ==
        '\0') {
      iVar1 = __cxa_guard_acquire(&GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)
                                   ::NullData);
      if (iVar1 != 0) {
        SerializedData::SerializedData(&GetSerializedShader::NullData);
        __cxa_atexit(SerializedData::~SerializedData,&GetSerializedShader::NullData,&__dso_handle);
        __cxa_guard_release(&GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)
                             ::NullData);
      }
    }
    this_local = (DeviceObjectArchive *)&GetSerializedShader::NullData;
  }
  return (SerializedData *)this_local;
}

Assistant:

const auto& GetSerializedShader(DeviceType Type, size_t Idx) const noexcept
    {
        const auto& DeviceShaders = m_DeviceShaders[static_cast<size_t>(Type)];
        if (Idx < DeviceShaders.size())
            return DeviceShaders[Idx];

        static const SerializedData NullData;
        return NullData;
    }